

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexDepth.c
# Opt level: O0

Gia_Man_t * Bmc_CexTarget(Gia_Man_t *p,int nFrames)

{
  int iVar1;
  int iVar2;
  Gia_Man_t *pGVar3;
  uint local_2c;
  int Limit;
  int i;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  Gia_Man_t *pGStack_10;
  int nFrames_local;
  Gia_Man_t *p_local;
  
  pNew._4_4_ = nFrames;
  pGStack_10 = p;
  iVar1 = Gia_ManPiNum(p);
  pTemp = Bmc_CexTargetEnlarge(pGStack_10,pNew._4_4_);
  for (local_2c = 0; (int)local_2c < nFrames * iVar1; local_2c = local_2c + 1) {
    printf("%3d : ",(ulong)local_2c);
    iVar2 = Gia_ManPiNum(pGStack_10);
    if ((int)local_2c % iVar2 == 0) {
      Gia_ManPrintStats(pTemp,(Gps_Par_t *)0x0);
    }
    pGVar3 = pTemp;
    pTemp = Gia_ManDupExist(pTemp,local_2c);
    Gia_ManStop(pGVar3);
  }
  Gia_ManPrintStats(pTemp,(Gps_Par_t *)0x0);
  pGVar3 = pTemp;
  iVar1 = Gia_ManRegNum(pGStack_10);
  pTemp = Gia_ManDupLastPis(pGVar3,iVar1);
  Gia_ManStop(pGVar3);
  Gia_ManPrintStats(pTemp,(Gps_Par_t *)0x0);
  pGVar3 = Gia_ManDupAppendCones(pGStack_10,&pTemp,1,1);
  Gia_ManStop(pTemp);
  Gia_AigerWrite(pGVar3,"miter3.aig",0,0);
  return pGVar3;
}

Assistant:

Gia_Man_t * Bmc_CexTarget( Gia_Man_t * p, int nFrames )
{
    Gia_Man_t * pNew, * pTemp;
    int i, Limit = nFrames * Gia_ManPiNum(p);
    pNew = Bmc_CexTargetEnlarge( p, nFrames );
    for ( i = 0; i < Limit; i++ )
    {
        printf( "%3d : ", i );
        if ( i % Gia_ManPiNum(p) == 0 )
            Gia_ManPrintStats( pNew, NULL );
        pNew = Gia_ManDupExist( pTemp = pNew, i );
        Gia_ManStop( pTemp );
    }
    Gia_ManPrintStats( pNew, NULL );
    pNew = Gia_ManDupLastPis( pTemp = pNew, Gia_ManRegNum(p) );
    Gia_ManStop( pTemp );  
    Gia_ManPrintStats( pNew, NULL );
    pTemp = Gia_ManDupAppendCones( p, &pNew, 1, 1 );
    Gia_ManStop( pNew );
    Gia_AigerWrite( pTemp, "miter3.aig", 0, 0 );
    return pTemp;
}